

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jump_canonization.cpp
# Opt level: O0

shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
 __thiscall
IRT::canonizeJumps(IRT *this,
                  shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
                  *trees)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
  *this_00;
  element_type *peVar2;
  pointer ppVar3;
  pointer tree_00;
  CStatement *__p;
  element_type *this_01;
  mapped_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  sVar4;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_80;
  undefined1 local_78 [8];
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  reorderedBlocks;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  basicBlocks;
  _Self local_40;
  const_iterator tree;
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
  local_28;
  undefined1 local_19;
  shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  *local_18;
  shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  *trees_local;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  *newTrees;
  
  local_19 = 0;
  local_18 = trees;
  trees_local = (shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
                 *)this;
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
             *)operator_new(0x30);
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->_M_t)._M_impl = 0;
  *(undefined8 *)&(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
  ::map(this_00);
  std::
  unique_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>>
  ::
  unique_ptr<std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>,void>
            ((unique_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>>
              *)&local_28,this_00);
  std::
  shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>
  ::
  shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>,void>
            ((shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>
              *)this,&local_28);
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
  ::~unique_ptr(&local_28);
  peVar2 = std::
           __shared_ptr_access<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)trees);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
       ::begin(peVar2);
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)trees);
    basicBlocks.
    super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
                  ::end(peVar2);
    bVar1 = std::operator!=(&local_40,
                            (_Self *)&basicBlocks.
                                      super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
             ::operator->(&local_40);
    tree_00 = std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
              get(&ppVar3->second);
    divideTreeIntoBasicBlocks
              ((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                *)&reorderedBlocks.
                   super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,tree_00);
    reorderByTracies((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                      *)local_78,
                     (vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                      *)&reorderedBlocks.
                         super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    optimizeBlocks((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                    *)local_78);
    __p = collectBlocksToTree((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                               *)local_78);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_80,__p);
    this_01 = std::
              __shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
             ::operator->(&local_40);
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
              ::operator[](this_01,&ppVar3->first);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (this_02,&local_80);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_80);
    std::
    vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ::~vector((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               *)local_78);
    std::
    vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ::~vector((vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               *)&reorderedBlocks.
                  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::operator++(&local_40);
  }
  sVar4.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
          )sVar4.
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<MethodToIRTMap> canonizeJumps(std::shared_ptr<const MethodToIRTMap> trees) {
        std::shared_ptr<MethodToIRTMap> newTrees =
                std::shared_ptr<MethodToIRTMap>(std::move(std::unique_ptr<MethodToIRTMap>(new MethodToIRTMap())));
        for (auto tree = trees->begin(); tree != trees->end(); ++tree) {
            std::vector<std::unique_ptr<CStatementList>> basicBlocks =
                    divideTreeIntoBasicBlocks(tree->second.get());

            std::vector<std::unique_ptr<CStatementList>> reorderedBlocks =
                    reorderByTracies(basicBlocks);

            optimizeBlocks(reorderedBlocks);

            (*newTrees)[tree->first] = std::move(std::unique_ptr<const CStatement>(
                    collectBlocksToTree(reorderedBlocks)));
        }

        return newTrees;
    }